

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

Bool Bezier_Down(black_PWorker worker,Int degree,TPoint *arc,TSplitter splitter,Long miny,Long maxy)

{
  char cVar1;
  Bool BVar2;
  Bool fresh;
  Bool result;
  Long maxy_local;
  Long miny_local;
  TSplitter splitter_local;
  TPoint *arc_local;
  Int degree_local;
  black_PWorker worker_local;
  
  arc->y = -arc->y;
  arc[1].y = -arc[1].y;
  arc[2].y = -arc[2].y;
  if (2 < degree) {
    arc[3].y = -arc[3].y;
  }
  cVar1 = worker->fresh;
  BVar2 = Bezier_Up(worker,degree,arc,splitter,-maxy,-miny);
  if ((cVar1 != '\0') && (worker->fresh == '\0')) {
    worker->cProfile->start = -worker->cProfile->start;
  }
  arc->y = -arc->y;
  return BVar2;
}

Assistant:

static Bool
  Bezier_Down( RAS_ARGS Int        degree,
                        TPoint*    arc,
                        TSplitter  splitter,
                        Long       miny,
                        Long       maxy )
  {
    Bool     result, fresh;


    arc[0].y = -arc[0].y;
    arc[1].y = -arc[1].y;
    arc[2].y = -arc[2].y;
    if ( degree > 2 )
      arc[3].y = -arc[3].y;

    fresh = ras.fresh;

    result = Bezier_Up( RAS_VARS degree, arc, splitter, -maxy, -miny );

    if ( fresh && !ras.fresh )
      ras.cProfile->start = -ras.cProfile->start;

    arc[0].y = -arc[0].y;
    return result;
  }